

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenStreamIOException.hpp
# Opt level: O2

void __thiscall
antlr::TokenStreamIOException::TokenStreamIOException(TokenStreamIOException *this,exception *e)

{
  char *__s;
  allocator<char> local_31;
  string local_30;
  
  __s = (char *)(**(code **)(*(long *)e + 0x10))(e);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,__s,&local_31);
  TokenStreamException::TokenStreamException(&this->super_TokenStreamException,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_TokenStreamException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__TokenStreamIOException_002f0e00;
  *(code **)&this->io = getenv;
  return;
}

Assistant:

TokenStreamIOException(const ANTLR_USE_NAMESPACE(std)exception& e)
	: TokenStreamException(e.what())
	, io(e)
	{
	}